

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O0

bool sptk::ComputeProbabilityOfTDistribution
               (double percentage_point,int degrees_of_freedom,double *probability)

{
  int iVar1;
  double *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar2;
  __type _Var3;
  double dVar4;
  double theta;
  int i;
  double prod;
  double sum;
  double sine;
  double cosine_squared;
  undefined8 local_58;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 local_1;
  
  if ((in_EDI < 1) || (in_RSI == (double *)0x0)) {
    local_1 = false;
  }
  else {
    dVar2 = (double)in_EDI / (in_XMM0_Qa * in_XMM0_Qa + (double)in_EDI);
    if (0.0 <= in_XMM0_Qa) {
      local_58 = sqrt(1.0 - dVar2);
    }
    else {
      local_58 = sqrt(1.0 - dVar2);
      local_58 = -local_58;
    }
    local_38 = 0.0;
    local_40 = local_58;
    iVar1 = in_EDI % 2;
    while (local_44 = iVar1 + 2, local_44 <= in_EDI) {
      local_38 = local_40 + local_38;
      local_40 = (((double)(iVar1 + 1) * dVar2) / (double)local_44) * local_40;
      iVar1 = local_44;
    }
    if (in_EDI % 2 == 0) {
      *in_RSI = (local_38 + 1.0) / 2.0;
    }
    else {
      _Var3 = std::sqrt<int>(0);
      dVar4 = atan(in_XMM0_Qa / _Var3);
      dVar2 = sqrt(dVar2);
      *in_RSI = (local_38 * dVar2 + dVar4) / 3.141592653589793 + 0.5;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ComputeProbabilityOfTDistribution(double percentage_point,
                                       int degrees_of_freedom,
                                       double* probability) {
  if (degrees_of_freedom <= 0 || NULL == probability) {
    return false;
  }

  const double cosine_squared(
      degrees_of_freedom /
      (degrees_of_freedom + percentage_point * percentage_point));
  const double sine((percentage_point < 0.0) ? -std::sqrt(1.0 - cosine_squared)
                                             : std::sqrt(1.0 - cosine_squared));

  double sum(0.0);
  double prod(sine);
  for (int i(degrees_of_freedom % 2 + 2); i <= degrees_of_freedom; i += 2) {
    sum += prod;
    prod *= (i - 1) * cosine_squared / i;
  }
  if (0 == degrees_of_freedom % 2) {
    *probability = (1.0 + sum) / 2.0;
  } else {
    const double theta(
        std::atan(percentage_point / std::sqrt(degrees_of_freedom)));
    *probability = 0.5 + (sum * std::sqrt(cosine_squared) + theta) / sptk::kPi;
  }

  return true;
}